

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest13::iterate(FunctionalTest13 *this)

{
  ostringstream *this_00;
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  code *pcVar6;
  FunctionalTest13 *pFVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLuint GVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_var;
  TestError *pTVar18;
  NotSupportedError *pNVar19;
  undefined8 uVar20;
  uint n_tc_subroutine;
  char *description;
  uint n_tc_id;
  uint n_te_subroutine;
  uint n_te_id;
  uint n_gs_subroutine;
  uint n_gs_id;
  GLuint *pGVar21;
  GLuint *pGVar22;
  long lVar23;
  uint uVar24;
  GLuint *pGVar25;
  GLuint *local_a08;
  GLuint *local_a00;
  GLint validate_status;
  FunctionalTest13 *local_9f0;
  ulong local_9e8;
  GLuint vs_subroutine_indices [2];
  GLuint te_subroutine_indices [2];
  GLuint tc_subroutine_indices [2];
  GLuint gs_subroutine_indices [2];
  GLuint fs_subroutine_indices [2];
  undefined1 local_958 [16];
  TestLog local_948 [13];
  ios_base local_8e0 [256];
  undefined4 auStack_7e0 [2];
  stringstream fs_subroutine_name_sstream;
  GLuint GStack_7d4;
  _func_int **local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  undefined4 local_7b8;
  GLuint local_7b4;
  GLuint *local_7b0;
  undefined4 local_7a8;
  GLuint local_7a4;
  GLuint *local_7a0;
  undefined4 local_798;
  GLuint local_794;
  GLuint *local_790;
  ios_base local_760 [8];
  ios_base aiStack_758 [264];
  stringstream vs_subroutine_name_sstream;
  undefined1 local_640 [376];
  stringstream te_subroutine_name_sstream;
  undefined1 local_4b8 [376];
  stringstream tc_subroutine_name_sstream;
  undefined1 local_330 [376];
  stringstream gs_subroutine_name_sstream;
  undefined1 local_1a8 [376];
  undefined8 *puVar17;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar17 = (undefined8 *)CONCAT44(extraout_var,iVar9);
  bVar8 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar8) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    _fs_subroutine_name_sstream = (pointer)&local_7c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fs_subroutine_name_sstream,"GL_ARB_shader_subroutine is not supported.",""
              );
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&fs_subroutine_name_sstream);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar8 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_separate_shader_objects");
  if (!bVar8) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    _fs_subroutine_name_sstream = (pointer)&local_7c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fs_subroutine_name_sstream,
               "GL_ARB_separate_shader_objects is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&fs_subroutine_name_sstream);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  uVar16 = 0;
  local_9f0 = this;
  do {
    pFVar7 = local_9f0;
    n_gs_id = uVar16 >> 1 & 1;
    n_tc_id = uVar16 >> 2 & 1;
    n_te_id = uVar16 >> 3 & 1;
    GVar1 = local_9f0->m_fs_po_ids[uVar16 & 1];
    GVar2 = local_9f0->m_gs_po_ids[n_gs_id];
    GVar3 = local_9f0->m_tc_po_ids[n_tc_id];
    GVar4 = local_9f0->m_te_po_ids[n_te_id];
    GVar5 = local_9f0->m_vs_po_ids[0xf < uVar16];
    (*(code *)puVar17[0x2d1])(local_9f0->m_pipeline_id,2);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bf7);
    (*(code *)puVar17[0x2d1])(pFVar7->m_pipeline_id,4,GVar2);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bfb);
    (*(code *)puVar17[0x2d1])(pFVar7->m_pipeline_id,8,GVar3);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bff);
    (*(code *)puVar17[0x2d1])(pFVar7->m_pipeline_id,0x10,GVar4);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c03);
    (*(code *)puVar17[0x2d1])(pFVar7->m_pipeline_id,1,GVar5);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c07);
    validate_status = 0;
    (*(code *)puVar17[0x2d3])(pFVar7->m_pipeline_id);
    dVar10 = (*(code *)puVar17[0x100])();
    glu::checkError(dVar10,"glValidateProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c0d);
    (*(code *)puVar17[0x134])(pFVar7->m_pipeline_id,0x8b83,&validate_status);
    dVar10 = (*(code *)puVar17[0x100])();
    uVar20 = 0x1c10;
    glu::checkError(dVar10,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c10);
    if (validate_status != 1) {
      pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar18,"Program pipeline has not been validated successfully.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x1c14);
LAB_009765df:
      __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    fs_subroutine_indices[0] = 0xffffffff;
    fs_subroutine_indices[1] = 0;
    gs_subroutine_indices[0] = 0xffffffff;
    gs_subroutine_indices[1] = 0;
    tc_subroutine_indices[0] = 0xffffffff;
    tc_subroutine_indices[1] = 0;
    te_subroutine_indices[0] = 0xffffffff;
    te_subroutine_indices[1] = 0;
    vs_subroutine_indices[0] = 0xffffffff;
    vs_subroutine_indices[1] = 0;
    uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
    pGVar21 = vs_subroutine_indices;
    pGVar22 = te_subroutine_indices;
    local_a08 = tc_subroutine_indices;
    local_a00 = gs_subroutine_indices;
    pGVar25 = fs_subroutine_indices;
    do {
      local_9e8 = CONCAT44(local_9e8._4_4_,(int)uVar20);
      std::__cxx11::stringstream::stringstream((stringstream *)&fs_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&gs_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&tc_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&te_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&vs_subroutine_name_sstream);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7c8,"SubroutineFS",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_7c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SubroutineGS",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"SubroutineTC",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"SubroutineTE",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"SubroutineVS",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)local_640);
      pcVar6 = (code *)puVar17[0x151];
      std::__cxx11::stringbuf::str();
      GVar11 = (*pcVar6)(GVar1,0x8b30,local_958._0_8_);
      *pGVar25 = GVar11;
      if ((TestLog *)local_958._0_8_ != local_948) {
        operator_delete((void *)local_958._0_8_,(ulong)((long)&(local_948[0].m_log)->flags + 1));
      }
      pcVar6 = (code *)puVar17[0x151];
      std::__cxx11::stringbuf::str();
      GVar11 = (*pcVar6)(GVar2,0x8dd9,local_958._0_8_);
      *local_a00 = GVar11;
      if ((TestLog *)local_958._0_8_ != local_948) {
        operator_delete((void *)local_958._0_8_,(ulong)((long)&(local_948[0].m_log)->flags + 1));
      }
      pcVar6 = (code *)puVar17[0x151];
      std::__cxx11::stringbuf::str();
      GVar11 = (*pcVar6)(GVar3,0x8e88,local_958._0_8_);
      *local_a08 = GVar11;
      if ((TestLog *)local_958._0_8_ != local_948) {
        operator_delete((void *)local_958._0_8_,(ulong)((long)&(local_948[0].m_log)->flags + 1));
      }
      pcVar6 = (code *)puVar17[0x151];
      std::__cxx11::stringbuf::str();
      GVar11 = (*pcVar6)(GVar4,0x8e87,local_958._0_8_);
      *pGVar22 = GVar11;
      if ((TestLog *)local_958._0_8_ != local_948) {
        operator_delete((void *)local_958._0_8_,(ulong)((long)&(local_948[0].m_log)->flags + 1));
      }
      pcVar6 = (code *)puVar17[0x151];
      std::__cxx11::stringbuf::str();
      GVar11 = (*pcVar6)(GVar5,0x8b31,local_958._0_8_);
      *pGVar21 = GVar11;
      if ((TestLog *)local_958._0_8_ != local_948) {
        operator_delete((void *)local_958._0_8_,(ulong)((long)&(local_948[0].m_log)->flags + 1));
      }
      dVar10 = (*(code *)puVar17[0x100])();
      glu::checkError(dVar10,"glGetSubroutineIndex() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c3b);
      if ((((*pGVar25 == 0xffffffff) || (*local_a00 == 0xffffffff)) || (*local_a08 == 0xffffffff))
         || ((*pGVar22 == 0xffffffff || (*pGVar21 == 0xffffffff)))) {
        local_958._0_8_ =
             ((local_9f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_958 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "At least one subroutine was not recognized by glGetSubroutineIndex() call. (fs:"
                   ,0x4f);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", gs:",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", tc:",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", te:",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", vs:",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,").",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_8e0);
        pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar18,"At least one subroutine was not recognized",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x1c4c);
        __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&vs_subroutine_name_sstream);
      std::ios_base::~ios_base((ios_base *)(local_640 + 0x70));
      std::__cxx11::stringstream::~stringstream((stringstream *)&te_subroutine_name_sstream);
      std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
      std::__cxx11::stringstream::~stringstream((stringstream *)&tc_subroutine_name_sstream);
      std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
      std::__cxx11::stringstream::~stringstream((stringstream *)&gs_subroutine_name_sstream);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      std::__cxx11::stringstream::~stringstream((stringstream *)&fs_subroutine_name_sstream);
      std::ios_base::~ios_base(aiStack_758);
      pGVar21 = vs_subroutine_indices + 1;
      pGVar22 = te_subroutine_indices + 1;
      local_a08 = tc_subroutine_indices + 1;
      local_a00 = gs_subroutine_indices + 1;
      pGVar25 = fs_subroutine_indices + 1;
      uVar20 = 0;
    } while ((local_9e8 & 1) != 0);
    iVar9 = (*(code *)puVar17[0x152])(GVar1,0x8b30,"function");
    iVar12 = (*(code *)puVar17[0x152])(GVar2,0x8dd9,"function");
    iVar13 = (*(code *)puVar17[0x152])(GVar3,0x8e88,"function");
    iVar14 = (*(code *)puVar17[0x152])(GVar4,0x8e87,"function");
    iVar15 = (*(code *)puVar17[0x152])(GVar5,0x8b31,"function");
    if (((iVar9 == -1) || (iVar12 == -1)) || ((iVar13 == -1 || ((iVar14 == -1 || (iVar15 == -1))))))
    {
      _fs_subroutine_name_sstream =
           (pointer)((local_9f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7d0,
                 "At least one subroutine uniform is considered inactive by glGetSubroutineUniformLocation (fs:"
                 ,0x5d);
      std::ostream::operator<<((ostringstream *)&local_7d0,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7d0,", gs:",5);
      std::ostream::operator<<((ostringstream *)&local_7d0,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7d0,", tc:",5);
      std::ostream::operator<<((ostringstream *)&local_7d0,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7d0,", te:",5);
      std::ostream::operator<<((ostringstream *)&local_7d0,iVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7d0,", vs:",5);
      std::ostream::operator<<((ostringstream *)&local_7d0,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7d0,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&fs_subroutine_name_sstream,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7d0);
      std::ios_base::~ios_base(local_760);
      pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar18,"At least one subroutine uniform is considered inactive",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x1c61);
      goto LAB_009765df;
    }
    uVar24 = 0;
    do {
      pFVar7 = local_9f0;
      local_9e8 = (ulong)(uVar24 & 1);
      n_gs_subroutine = uVar24 >> 1 & 1;
      n_tc_subroutine = uVar24 >> 2 & 1;
      n_te_subroutine = uVar24 >> 3 & 1;
      GStack_7d4 = GVar1;
      _fs_subroutine_name_sstream = 0x8b30;
      local_7d0 = (_func_int **)(fs_subroutine_indices + local_9e8);
      local_7c8._M_allocated_capacity._0_4_ = 0x8dd9;
      local_7c8._M_allocated_capacity._4_4_ = GVar2;
      local_7c8._8_8_ = gs_subroutine_indices + n_gs_subroutine;
      local_7b8 = 0x8e88;
      local_7b4 = GVar3;
      local_7b0 = tc_subroutine_indices + n_tc_subroutine;
      local_7a8 = 0x8e87;
      local_7a4 = GVar4;
      local_7a0 = te_subroutine_indices + n_te_subroutine;
      local_798 = 0x8b31;
      local_794 = GVar5;
      local_790 = vs_subroutine_indices + (0xf < uVar24);
      lVar23 = 8;
      do {
        (*(code *)*puVar17)(pFVar7->m_pipeline_id,*(undefined4 *)((long)auStack_7e0 + lVar23 + 4));
        dVar10 = (*(code *)puVar17[0x100])();
        glu::checkError(dVar10,"glActiveShaderProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c7f);
        (*(code *)puVar17[0x2cd])
                  (*(undefined4 *)((long)auStack_7e0 + lVar23),1,
                   *(undefined8 *)(&fs_subroutine_name_sstream + lVar23));
        dVar10 = (*(code *)puVar17[0x100])();
        glu::checkError(dVar10,"glUniformSubroutinesuiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c82);
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x58);
      (*(code *)puVar17[0x31])(0x4000);
      dVar10 = (*(code *)puVar17[0x100])();
      glu::checkError(dVar10,"glClear() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c87);
      (*(code *)puVar17[0xa7])(0xe,0,1);
      dVar10 = (*(code *)puVar17[0x100])();
      glu::checkError(dVar10,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c8a);
      (*(code *)puVar17[0x244])
                (0,0,pFVar7->m_to_width,pFVar7->m_to_height,0x1908,0x1406,pFVar7->m_read_buffer);
      dVar10 = (*(code *)puVar17[0x100])();
      glu::checkError(dVar10,"glReadPixels() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c90);
      verifyReadBuffer(pFVar7,uVar16 & 1,(uint)local_9e8,n_gs_id,n_gs_subroutine,n_tc_id,
                       n_tc_subroutine,n_te_id,n_te_subroutine,(uint)(0xf < uVar16),
                       (uint)(0xf < uVar24));
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0x20);
    uVar16 = uVar16 + 1;
    if (uVar16 == 0x20) {
      bVar8 = local_9f0->m_has_test_passed == false;
      if (bVar8) {
        description = "Fail";
      }
      else {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_9f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar8,
                 description);
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest13::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine and GL_ARB_separate_shader_objects
	 * are not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		throw tcu::NotSupportedError("GL_ARB_separate_shader_objects is not supported");
	}

	/* Initialize all GL objects before we continue */
	initTest();

	/* Iterate over all possible FS/GS/TC/TE/VS permutations */
	for (int n_shader_permutation = 0; n_shader_permutation < 32 /* 2^5 */; ++n_shader_permutation)
	{
		const unsigned int n_fs_idx = ((n_shader_permutation & (1 << 0)) != 0) ? 1 : 0;
		const unsigned int n_gs_idx = ((n_shader_permutation & (1 << 1)) != 0) ? 1 : 0;
		const unsigned int n_tc_idx = ((n_shader_permutation & (1 << 2)) != 0) ? 1 : 0;
		const unsigned int n_te_idx = ((n_shader_permutation & (1 << 3)) != 0) ? 1 : 0;
		const unsigned int n_vs_idx = ((n_shader_permutation & (1 << 4)) != 0) ? 1 : 0;
		const unsigned int fs_po_id = m_fs_po_ids[n_fs_idx];
		const unsigned int gs_po_id = m_gs_po_ids[n_gs_idx];
		const unsigned int tc_po_id = m_tc_po_ids[n_tc_idx];
		const unsigned int te_po_id = m_te_po_ids[n_te_idx];
		const unsigned int vs_po_id = m_vs_po_ids[n_vs_idx];

		/* Configure fragment shader stage */
		gl.useProgramStages(m_pipeline_id, GL_FRAGMENT_SHADER_BIT, fs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit");

		/* Configure geometry shader stage */
		gl.useProgramStages(m_pipeline_id, GL_GEOMETRY_SHADER_BIT, gs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit");

		/* Configure tessellation control shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_CONTROL_SHADER_BIT, tc_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit");

		/* Configure tessellation evaluation shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_EVALUATION_SHADER_BIT, te_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit");

		/* Configure vertex shader stage */
		gl.useProgramStages(m_pipeline_id, GL_VERTEX_SHADER_BIT, vs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit");

		/* Validate the pipeline */
		glw::GLint validate_status = GL_FALSE;

		gl.validateProgramPipeline(m_pipeline_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() call failed.");

		gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

		if (validate_status != GL_TRUE)
		{
			TCU_FAIL("Program pipeline has not been validated successfully.");
		}

		/* Retrieve subroutine indices */
		GLuint fs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  fs_subroutine_uniform_index = 0;
		GLuint gs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  gs_subroutine_uniform_index = 0;
		GLuint tc_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  tc_subroutine_uniform_index = 0;
		GLuint te_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  te_subroutine_uniform_index = 0;
		GLuint vs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  vs_subroutine_uniform_index = 0;

		for (unsigned int n_subroutine = 0; n_subroutine < 2; ++n_subroutine)
		{
			std::stringstream fs_subroutine_name_sstream;
			std::stringstream gs_subroutine_name_sstream;
			std::stringstream tc_subroutine_name_sstream;
			std::stringstream te_subroutine_name_sstream;
			std::stringstream vs_subroutine_name_sstream;

			fs_subroutine_name_sstream << "SubroutineFS" << (n_subroutine + 1);
			gs_subroutine_name_sstream << "SubroutineGS" << (n_subroutine + 1);
			tc_subroutine_name_sstream << "SubroutineTC" << (n_subroutine + 1);
			te_subroutine_name_sstream << "SubroutineTE" << (n_subroutine + 1);
			vs_subroutine_name_sstream << "SubroutineVS" << (n_subroutine + 1);

			fs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(fs_po_id, GL_FRAGMENT_SHADER, fs_subroutine_name_sstream.str().c_str());
			gs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(gs_po_id, GL_GEOMETRY_SHADER, gs_subroutine_name_sstream.str().c_str());
			tc_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(tc_po_id, GL_TESS_CONTROL_SHADER, tc_subroutine_name_sstream.str().c_str());
			te_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(te_po_id, GL_TESS_EVALUATION_SHADER, te_subroutine_name_sstream.str().c_str());
			vs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(vs_po_id, GL_VERTEX_SHADER, vs_subroutine_name_sstream.str().c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

			if (fs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				gs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				tc_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				te_subroutine_indices[n_subroutine] == (GLuint)-1 || vs_subroutine_indices[n_subroutine] == (GLuint)-1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "At least one subroutine was not recognized by glGetSubroutineIndex() call. "
									  "(fs:"
								   << fs_subroutine_indices[n_subroutine]
								   << ", gs:" << gs_subroutine_indices[n_subroutine]
								   << ", tc:" << tc_subroutine_indices[n_subroutine]
								   << ", te:" << te_subroutine_indices[n_subroutine]
								   << ", vs:" << vs_subroutine_indices[n_subroutine] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("At least one subroutine was not recognized");
			}
		} /* for (both subroutines) */

		/* Retrieve subroutine uniform indices */
		fs_subroutine_uniform_index = gl.getSubroutineUniformLocation(fs_po_id, GL_FRAGMENT_SHADER, "function");
		gs_subroutine_uniform_index = gl.getSubroutineUniformLocation(gs_po_id, GL_GEOMETRY_SHADER, "function");
		tc_subroutine_uniform_index = gl.getSubroutineUniformLocation(tc_po_id, GL_TESS_CONTROL_SHADER, "function");
		te_subroutine_uniform_index = gl.getSubroutineUniformLocation(te_po_id, GL_TESS_EVALUATION_SHADER, "function");
		vs_subroutine_uniform_index = gl.getSubroutineUniformLocation(vs_po_id, GL_VERTEX_SHADER, "function");

		if (fs_subroutine_uniform_index == -1 || gs_subroutine_uniform_index == -1 ||
			tc_subroutine_uniform_index == -1 || te_subroutine_uniform_index == -1 || vs_subroutine_uniform_index == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "At least one subroutine uniform is considered inactive by "
														   "glGetSubroutineUniformLocation ("
														   "fs:"
							   << fs_subroutine_uniform_index << ", gs:" << gs_subroutine_uniform_index
							   << ", tc:" << tc_subroutine_uniform_index << ", te:" << te_subroutine_uniform_index
							   << ", vs:" << vs_subroutine_uniform_index << ")." << tcu::TestLog::EndMessage;

			TCU_FAIL("At least one subroutine uniform is considered inactive");
		}

		/* Check if both subroutines work correctly in each stage */
		for (int n_subroutine_permutation = 0; n_subroutine_permutation < 32; /* 2^5 */
			 ++n_subroutine_permutation)
		{
			unsigned int n_fs_subroutine = ((n_subroutine_permutation & (1 << 0)) != 0) ? 1 : 0;
			unsigned int n_gs_subroutine = ((n_subroutine_permutation & (1 << 1)) != 0) ? 1 : 0;
			unsigned int n_tc_subroutine = ((n_subroutine_permutation & (1 << 2)) != 0) ? 1 : 0;
			unsigned int n_te_subroutine = ((n_subroutine_permutation & (1 << 3)) != 0) ? 1 : 0;
			unsigned int n_vs_subroutine = ((n_subroutine_permutation & (1 << 4)) != 0) ? 1 : 0;

			/* Configure subroutine uniforms */
			struct
			{
				glw::GLenum  stage;
				glw::GLuint  po_id;
				glw::GLuint* indices;
			} configurations[] = {
				{ GL_FRAGMENT_SHADER, fs_po_id, fs_subroutine_indices + n_fs_subroutine },
				{ GL_GEOMETRY_SHADER, gs_po_id, gs_subroutine_indices + n_gs_subroutine },
				{ GL_TESS_CONTROL_SHADER, tc_po_id, tc_subroutine_indices + n_tc_subroutine },
				{ GL_TESS_EVALUATION_SHADER, te_po_id, te_subroutine_indices + n_te_subroutine },
				{ GL_VERTEX_SHADER, vs_po_id, vs_subroutine_indices + n_vs_subroutine },
			};

			for (int i = 0; i < 5; ++i)
			{
				gl.activeShaderProgram(m_pipeline_id, configurations[i].po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveShaderProgram() call failed.");

				gl.uniformSubroutinesuiv(configurations[i].stage, 1 /* count */, configurations[i].indices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");
			}

			/* Render a full-screen quad with the pipeline */
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

			/* Read color attachment's contents */
			gl.readPixels(0, /* x */
						  0, /* y */
						  m_to_width, m_to_height, GL_RGBA, GL_FLOAT, m_read_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			/* Verify the contents */
			verifyReadBuffer(n_fs_idx, n_fs_subroutine, n_gs_idx, n_gs_subroutine, n_tc_idx, n_tc_subroutine, n_te_idx,
							 n_te_subroutine, n_vs_idx, n_vs_subroutine);
		} /* for (all subroutine permutations) */
	}	 /* for (all program shader object permutations) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}